

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_multipivot.cpp
# Opt level: O3

void multikey_multipivot<unsigned_short,32u>(uchar **strings,size_t n,size_t depth)

{
  _Rb_tree_header *__position;
  uchar *puVar1;
  size_t n_00;
  size_t n_01;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  byte *pbVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  size_t i_1;
  void *__src;
  uint j;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  undefined2 uVar22;
  ulong uVar23;
  uchar **ppuVar24;
  unsigned_long uVar25;
  byte bVar26;
  byte *__ptr;
  int iVar27;
  bool bVar28;
  undefined4 uVar29;
  double dVar30;
  undefined1 auVar31 [16];
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  vector<unsigned_short,_std::allocator<unsigned_short>_> sample_array;
  array<unsigned_short,_32UL> pivots;
  set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> sample;
  array<unsigned_long,_65UL> bucketsize;
  void *local_2e0;
  long local_2d8;
  ushort uStack_2ca;
  _Alloc_node local_2c8 [7];
  ushort local_28a;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_288;
  double local_258;
  double dStack_250;
  ushort local_248 [8];
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  size_t local_40;
  size_t local_38;
  
  if (n < 15000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  __position = &local_288._M_impl.super__Rb_tree_header;
  local_288._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar27 = 0;
  local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar20 = n - 7;
  auVar31._8_4_ = (int)((ulong)lVar20 >> 0x20);
  auVar31._0_8_ = lVar20;
  auVar31._12_4_ = 0x45300000;
  dStack_250 = auVar31._8_8_ - 1.9342813113834067e+25;
  local_258 = dStack_250 + ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
  local_288._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_288._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  do {
    dVar30 = drand48();
    uVar19 = (ulong)(dVar30 * local_258);
    uVar19 = (long)(dVar30 * local_258 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19;
    if (n <= uVar19 + 6) {
      __assert_fail("pos+6 < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                    ,0x180,
                    "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned short, Pivots = 32U]"
                   );
    }
    lVar20 = 0;
    do {
      puVar1 = strings[uVar19 + lVar20];
      if (puVar1 == (uchar *)0x0) goto LAB_001baf7e;
      if (puVar1[depth] == '\0') {
        uVar22 = 0;
      }
      else {
        uVar22 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      *(undefined2 *)((long)&local_238 + lVar20 * 2) = uVar22;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 7);
    lVar20 = 0;
    local_2c8[0]._M_t = &local_288;
    do {
      std::
      _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
      ::
      _M_insert_unique_<unsigned_short&,std::_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>::_Alloc_node>
                ((_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
                  *)&local_288,(const_iterator)__position,
                 (unsigned_short *)((long)&local_238 + lVar20),local_2c8);
      lVar20 = lVar20 + 2;
    } while (lVar20 != 0xe);
    iVar27 = iVar27 + 1;
  } while (iVar27 != 0x20);
  local_238._0_2_ = 1;
  if (local_288._M_impl.super__Rb_tree_header._M_node_count < 0x20) {
    do {
      if ((char)(ushort)local_238 == '\0') {
        local_238._0_2_ = (ushort)local_238 | 1;
      }
      std::
      _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
      ::_M_insert_unique<unsigned_short_const&>
                ((_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
                  *)&local_288,(unsigned_short *)&local_238);
      local_238._0_2_ = (ushort)local_238 + 1;
    } while (local_288._M_impl.super__Rb_tree_header._M_node_count < 0x20);
  }
  std::vector<unsigned_short,std::allocator<unsigned_short>>::
  vector<std::_Rb_tree_const_iterator<unsigned_short>,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_2e0,
             (_Rb_tree_const_iterator<unsigned_short>)
             local_288._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_short>)__position,(allocator_type *)&local_238);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::clear(&local_288);
  uVar19 = (ulong)(local_2d8 - (long)local_2e0) >> 6;
  if ((int)uVar19 == 0) {
    __assert_fail("step > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                  ,0x191,
                  "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned short, Pivots = 32U]"
                 );
  }
  uVar23 = 0;
  lVar20 = 0;
  do {
    *(undefined2 *)((long)&local_2c8[0]._M_t + lVar20 * 2) =
         *(undefined2 *)((long)local_2e0 + (uVar23 & 0xffffffff) * 2);
    lVar20 = lVar20 + 1;
    uVar23 = uVar23 + uVar19;
  } while (lVar20 != 0x20);
  iVar27 = posix_memalign((void **)&local_238,0x10,n);
  pbVar10 = (byte *)CONCAT26(local_238._6_2_,
                             CONCAT24(local_238._4_2_,CONCAT22(local_238._2_2_,(ushort)local_238)));
  lVar20 = 0;
  do {
    auVar31 = ZEXT416(*(ushort *)((long)&local_2c8[0]._M_t + lVar20) ^ 0xffff8000);
    auVar31 = pshuflw(auVar31,auVar31,0);
    uVar29 = auVar31._0_4_;
    *(undefined4 *)(&local_238 + lVar20) = uVar29;
    *(undefined4 *)((long)&local_238 + lVar20 * 8 + 4) = uVar29;
    *(undefined4 *)(&uStack_230 + lVar20) = uVar29;
    *(undefined4 *)((long)&uStack_230 + lVar20 * 8 + 4) = uVar29;
    lVar20 = lVar20 + 2;
  } while (lVar20 != 0x40);
  __ptr = (byte *)0x0;
  if (iVar27 == 0) {
    __ptr = pbVar10;
  }
  uVar19 = n & 0xfffffffffffffff0;
  if (uVar19 != 0) {
    uVar23 = 0;
    ppuVar24 = strings;
    do {
      lVar20 = 0;
      do {
        puVar1 = ppuVar24[lVar20];
        if (puVar1 == (uchar *)0x0) goto LAB_001baf7e;
        if (puVar1[depth] == '\0') {
          uVar56 = 0;
        }
        else {
          uVar56 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        local_248[lVar20] = uVar56;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 8);
      uVar32 = local_248[0] ^ 0x8000;
      uVar34 = local_248[1] ^ 0x8000;
      uVar36 = local_248[2] ^ 0x8000;
      uVar38 = local_248[3] ^ 0x8000;
      uVar40 = local_248[4] ^ 0x8000;
      uVar42 = local_248[5] ^ 0x8000;
      uVar44 = local_248[6] ^ 0x8000;
      uVar46 = local_248[7] ^ 0x8000;
      uVar33 = 0;
      uVar35 = 0;
      uVar37 = 0;
      uVar39 = 0;
      uVar41 = 0;
      uVar43 = 0;
      uVar45 = 0;
      uVar47 = 0;
      lVar20 = 0x10;
      uVar56 = (ushort)local_238;
      uVar57 = local_238._2_2_;
      uVar58 = local_238._4_2_;
      uVar59 = local_238._6_2_;
      uVar60 = (ushort)uStack_230;
      uVar61 = uStack_230._2_2_;
      uVar62 = uStack_230._4_2_;
      uVar63 = uStack_230._6_2_;
      uVar11 = 1;
      uVar12 = 1;
      uVar13 = 1;
      uVar14 = 1;
      uVar15 = 1;
      uVar16 = 1;
      uVar17 = 1;
      uVar18 = 1;
      do {
        uVar55 = uVar18;
        uVar54 = uVar17;
        uVar53 = uVar16;
        uVar52 = uVar15;
        uVar51 = uVar14;
        uVar50 = uVar13;
        uVar49 = uVar12;
        uVar48 = uVar11;
        uVar2 = *(ushort *)((long)&local_238 + lVar20);
        uVar3 = *(ushort *)((long)&local_238 + lVar20 + 2);
        uVar4 = *(ushort *)((long)&local_238 + lVar20 + 4);
        uVar5 = *(ushort *)((long)&local_238 + lVar20 + 6);
        uVar6 = *(ushort *)((long)&uStack_230 + lVar20);
        uVar7 = *(ushort *)((long)&uStack_230 + lVar20 + 2);
        uVar8 = *(ushort *)((long)&uStack_230 + lVar20 + 4);
        uVar9 = *(ushort *)((long)&uStack_230 + lVar20 + 6);
        uVar33 = -(ushort)((short)uVar32 < (short)uVar2) &
                 -(ushort)((short)uVar56 < (short)uVar32) & uVar48 + 1 |
                 -(ushort)(uVar32 == uVar56) & uVar48 | uVar33;
        uVar35 = -(ushort)((short)uVar34 < (short)uVar3) &
                 -(ushort)((short)uVar57 < (short)uVar34) & uVar49 + 1 |
                 -(ushort)(uVar34 == uVar57) & uVar49 | uVar35;
        uVar37 = -(ushort)((short)uVar36 < (short)uVar4) &
                 -(ushort)((short)uVar58 < (short)uVar36) & uVar50 + 1 |
                 -(ushort)(uVar36 == uVar58) & uVar50 | uVar37;
        uVar39 = -(ushort)((short)uVar38 < (short)uVar5) &
                 -(ushort)((short)uVar59 < (short)uVar38) & uVar51 + 1 |
                 -(ushort)(uVar38 == uVar59) & uVar51 | uVar39;
        uVar41 = -(ushort)((short)uVar40 < (short)uVar6) &
                 -(ushort)((short)uVar60 < (short)uVar40) & uVar52 + 1 |
                 -(ushort)(uVar40 == uVar60) & uVar52 | uVar41;
        uVar43 = -(ushort)((short)uVar42 < (short)uVar7) &
                 -(ushort)((short)uVar61 < (short)uVar42) & uVar53 + 1 |
                 -(ushort)(uVar42 == uVar61) & uVar53 | uVar43;
        uVar45 = -(ushort)((short)uVar44 < (short)uVar8) &
                 -(ushort)((short)uVar62 < (short)uVar44) & uVar54 + 1 |
                 -(ushort)(uVar44 == uVar62) & uVar54 | uVar45;
        uVar47 = -(ushort)((short)uVar46 < (short)uVar9) &
                 -(ushort)((short)uVar63 < (short)uVar46) & uVar55 + 1 |
                 -(ushort)(uVar46 == uVar63) & uVar55 | uVar47;
        lVar20 = lVar20 + 0x10;
        uVar56 = uVar2;
        uVar57 = uVar3;
        uVar58 = uVar4;
        uVar59 = uVar5;
        uVar60 = uVar6;
        uVar61 = uVar7;
        uVar62 = uVar8;
        uVar63 = uVar9;
        uVar11 = uVar48 + 2;
        uVar12 = uVar49 + 2;
        uVar13 = uVar50 + 2;
        uVar14 = uVar51 + 2;
        uVar15 = uVar52 + 2;
        uVar16 = uVar53 + 2;
        uVar17 = uVar54 + 2;
        uVar18 = uVar55 + 2;
      } while (lVar20 != 0x200);
      uVar33 = -(ushort)((short)uVar2 < (short)uVar32) & uVar48 + 3 |
               -(ushort)(uVar32 == uVar2) & uVar48 + 2 | uVar33;
      uVar35 = -(ushort)((short)uVar3 < (short)uVar34) & uVar49 + 3 |
               -(ushort)(uVar34 == uVar3) & uVar49 + 2 | uVar35;
      uVar37 = -(ushort)((short)uVar4 < (short)uVar36) & uVar50 + 3 |
               -(ushort)(uVar36 == uVar4) & uVar50 + 2 | uVar37;
      uVar39 = -(ushort)((short)uVar5 < (short)uVar38) & uVar51 + 3 |
               -(ushort)(uVar38 == uVar5) & uVar51 + 2 | uVar39;
      uVar41 = -(ushort)((short)uVar6 < (short)uVar40) & uVar52 + 3 |
               -(ushort)(uVar40 == uVar6) & uVar52 + 2 | uVar41;
      uVar43 = -(ushort)((short)uVar7 < (short)uVar42) & uVar53 + 3 |
               -(ushort)(uVar42 == uVar7) & uVar53 + 2 | uVar43;
      uVar45 = -(ushort)((short)uVar8 < (short)uVar44) & uVar54 + 3 |
               -(ushort)(uVar44 == uVar8) & uVar54 + 2 | uVar45;
      uVar47 = -(ushort)((short)uVar9 < (short)uVar46) & uVar55 + 3 |
               -(ushort)(uVar46 == uVar9) & uVar55 + 2 | uVar47;
      *(ulong *)(__ptr + uVar23) =
           CONCAT17((0 < (short)uVar47) * ((short)uVar47 < 0x100) * (char)uVar47 -
                    (0xff < (short)uVar47),
                    CONCAT16((0 < (short)uVar45) * ((short)uVar45 < 0x100) * (char)uVar45 -
                             (0xff < (short)uVar45),
                             CONCAT15((0 < (short)uVar43) * ((short)uVar43 < 0x100) * (char)uVar43 -
                                      (0xff < (short)uVar43),
                                      CONCAT14((0 < (short)uVar41) * ((short)uVar41 < 0x100) *
                                               (char)uVar41 - (0xff < (short)uVar41),
                                               CONCAT13((0 < (short)uVar39) *
                                                        ((short)uVar39 < 0x100) * (char)uVar39 -
                                                        (0xff < (short)uVar39),
                                                        CONCAT12((0 < (short)uVar37) *
                                                                 ((short)uVar37 < 0x100) *
                                                                 (char)uVar37 -
                                                                 (0xff < (short)uVar37),
                                                                 CONCAT11((0 < (short)uVar35) *
                                                                          ((short)uVar35 < 0x100) *
                                                                          (char)uVar35 -
                                                                          (0xff < (short)uVar35),
                                                                          (0 < (short)uVar33) *
                                                                          ((short)uVar33 < 0x100) *
                                                                          (char)uVar33 -
                                                                          (0xff < (short)uVar33)))))
                                     )));
      uVar23 = uVar23 + 8;
      ppuVar24 = ppuVar24 + 8;
    } while (uVar23 < uVar19);
  }
  if (uVar19 != n) {
    do {
      puVar1 = strings[uVar19];
      if (puVar1 == (uchar *)0x0) {
LAB_001baf7e:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar1[depth] == '\0') {
        uVar56 = 0;
      }
      else {
        uVar56 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
      }
      if (uVar56 < (ushort)local_2c8[0]._M_t) {
        __ptr[uVar19] = 0;
      }
      else {
        lVar20 = 2;
        bVar26 = 1;
        do {
          if (uVar56 == *(ushort *)((long)&uStack_2ca + lVar20)) {
            __ptr[uVar19] = bVar26;
            goto LAB_001bad3d;
          }
          if ((*(ushort *)((long)&uStack_2ca + lVar20) < uVar56) &&
             (uVar56 < *(ushort *)((long)&local_2c8[0]._M_t + lVar20))) {
            __ptr[uVar19] = (byte)lVar20;
            goto LAB_001bad3d;
          }
          lVar20 = lVar20 + 2;
          bVar26 = bVar26 + 2;
        } while (lVar20 != 0x40);
        if (uVar56 == local_28a) {
          __ptr[uVar19] = 0x3f;
        }
        else {
          __ptr[uVar19] = 0x40;
        }
      }
LAB_001bad3d:
      uVar19 = uVar19 + 1;
    } while (uVar19 < n);
  }
  memset(&local_238,0,0x208);
  bVar26 = *__ptr;
  (&local_238)[bVar26] = (&local_238)[bVar26] + 1;
  if (__ptr[1] < bVar26) {
    uVar19 = 1;
    bVar28 = true;
  }
  else {
    uVar19 = 1;
    bVar26 = __ptr[1];
    do {
      (&local_238)[bVar26] = (&local_238)[bVar26] + 1;
      if ((2 - n) + uVar19 == 1) goto LAB_001bae4a;
      lVar20 = uVar19 + 1;
      uVar19 = uVar19 + 1;
      bVar28 = bVar26 <= __ptr[lVar20];
      bVar26 = __ptr[lVar20];
    } while (bVar28);
    bVar28 = uVar19 < n;
  }
  if (uVar19 < n) {
    do {
      (&local_238)[__ptr[uVar19]] = (&local_238)[__ptr[uVar19]] + 1;
      uVar19 = uVar19 + 1;
    } while (n != uVar19);
  }
  if (bVar28) {
    __src = malloc(n * 8);
    multikey_multipivot<unsigned_short,_32U>::bucketindex._M_elems[0] = 0;
    lVar20 = 0;
    uVar25 = 0;
    do {
      uVar25 = uVar25 + (&local_238)[lVar20];
      multikey_multipivot<unsigned_short,_32U>::bucketindex._M_elems[lVar20 + 1] = uVar25;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x40);
    sVar21 = 0;
    do {
      puVar1 = strings[sVar21];
      uVar25 = multikey_multipivot<unsigned_short,_32U>::bucketindex._M_elems[__ptr[sVar21]];
      multikey_multipivot<unsigned_short,_32U>::bucketindex._M_elems[__ptr[sVar21]] = uVar25 + 1;
      *(uchar **)((long)__src + uVar25 * 8) = puVar1;
      sVar21 = sVar21 + 1;
    } while (n != sVar21);
    memcpy(strings,__src,n * 8);
    free(__src);
  }
LAB_001bae4a:
  free(__ptr);
  sVar21 = CONCAT26(local_238._6_2_,
                    CONCAT24(local_238._4_2_,CONCAT22(local_238._2_2_,(ushort)local_238)));
  if (sVar21 != 0) {
    multikey_multipivot<unsigned_short,32u>(strings,sVar21,depth);
  }
  lVar20 = 0;
  do {
    n_00 = (&uStack_230)[lVar20 * 2];
    if ((n_00 != 0) && (*(char *)((long)&local_2c8[0]._M_t + lVar20 * 2) != '\0')) {
      multikey_multipivot<unsigned_short,32u>(strings + sVar21,n_00,depth + 2);
    }
    n_01 = (&uStack_220)[lVar20 * 2 + -1];
    if (n_01 != 0) {
      uVar56 = *(ushort *)((long)&local_2c8[0]._M_t + lVar20 * 2);
      uVar57 = *(ushort *)((long)&local_2c8[0]._M_t + lVar20 * 2 + 2);
      if (uVar56 == uVar57) {
        __assert_fail("a != b",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                      ,0x57,"unsigned int lcp(uint16_t, uint16_t)");
      }
      multikey_multipivot<unsigned_short,32u>
                (strings + n_00 + sVar21,n_01,
                 ((uVar56 & 0xff00) == (uVar57 & 0xff00) && (uVar56 & 0xff00) != 0) + depth);
    }
    lVar20 = lVar20 + 1;
    sVar21 = n_01 + n_00 + sVar21;
  } while (lVar20 != 0x1f);
  if (local_40 != 0) {
    if ((char)local_28a != '\0') {
      multikey_multipivot<unsigned_short,32u>(strings + sVar21,local_40,depth + 2);
    }
    sVar21 = sVar21 + local_40;
  }
  if (local_38 != 0) {
    multikey_multipivot<unsigned_short,32u>(strings + sVar21,local_38,depth);
  }
  if (local_2e0 != (void *)0x0) {
    operator_delete(local_2e0);
  }
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_288);
  return;
}

Assistant:

static void
multikey_multipivot(unsigned char** strings, size_t n, size_t depth)
{
	static_assert(Pivots > 0, "Pivots must be non-zero");
	static_assert(total_buckets(Pivots) < 0x100, "total number of bucket must be max 255");
	if (n < 15000) {
		mkqsort(strings, n, depth);
		return;
	}
	// TODO: collect frequencies to gain knowledge about distribution
	std::set<CharT> sample;
	for (unsigned i=0; i < Pivots; ++i) {
		double r=drand48();
		size_t pos = ((size_t)((n-7)*r));
		assert(pos+6 < n);
		std::array<CharT, 7> tmp;
		for (unsigned j=0;j<tmp.size();++j) {
			tmp[j] = get_char<CharT>(strings[pos+j], depth);
		}
		sample.insert(tmp.begin(), tmp.end());
	}
	// We _must_ select enough pivots -> insert junk.
	for (CharT i=1; sample.size() < Pivots; ++i) {
		if (is_end(i)) ++i;
		sample.insert(i);
	}
	// Pick pivots from the sample.
	std::vector<CharT> sample_array(sample.begin(), sample.end());
	sample.clear();
	std::array<CharT, Pivots> pivots;
	unsigned step = sample_array.size() / Pivots;
	assert(step > 0);
	for (unsigned i=0; i < Pivots; ++i) {
		pivots[i] = sample_array[step*i];
	}
	uint8_t* restrict oracle = static_cast<uint8_t*>(_mm_malloc(n, 16));
	fill_oracle<Pivots>(strings, n, oracle, pivots, depth);
	std::array<size_t, total_buckets(Pivots)> bucketsize;
	bucketsize.fill(0);
	uint8_t prev = oracle[0];
	bool sorted = true;
	size_t i=1;
	++bucketsize[prev];
	for (; i < n; ++i) {
		uint8_t bucket = oracle[i];
		if (prev > bucket) {
			sorted = false; break;
		}
		++bucketsize[bucket];
		prev = bucket;
	}
	for (; i < n; ++i)
		++bucketsize[oracle[i]];
	if (not sorted) {
		unsigned char** sorted = (unsigned char**)
			malloc(n*sizeof(unsigned char*));
		static std::array<size_t, total_buckets(Pivots)> bucketindex;
		bucketindex[0] = 0;
		for (unsigned i=1; i < total_buckets(Pivots); ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < n; ++i)
			sorted[bucketindex[oracle[i]]++] = strings[i];
		memcpy(strings, sorted, n*sizeof(unsigned char*));
		free(sorted);
	}
	_mm_free(oracle);
	size_t b=0;
	size_t bsum = bucketsize[0];
	if (bsum) multikey_multipivot<CharT, Pivots>(strings, bsum, depth);
	for (unsigned i=0; i < Pivots-1; ++i) {
		b = bucketsize[middle_bucket(i)];
		if (b and not is_end(pivots[i])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
					depth+sizeof(CharT));
		}
		bsum += b;
		if ((b = bucketsize[right_bucket(i)])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
				depth+lcp(pivots[i], pivots[i+1]));
		}
		bsum += b;
	}
	if ((b = bucketsize[middle_bucket(Pivots-1)])) {
		if (not is_end(pivots[Pivots-1]))
			multikey_multipivot<CharT, Pivots>(strings+bsum,
				b, depth+sizeof(CharT));
		bsum += b;
	}
	if ((b = bucketsize[right_bucket(Pivots-1)])) {
		multikey_multipivot<CharT, Pivots>(strings+bsum, b, depth);
	}
}